

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O3

void __thiscall TreeDecomposition::TreeDecomposition(TreeDecomposition *this)

{
  (this->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_leafNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_attributes).super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_attributes).super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_attributes).super__Vector_base<Attribute_*,_std::allocator<Attribute_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_relations).super__Vector_base<TDNode_*,_std::allocator<TDNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_attributeMap)._M_h._M_buckets = &(this->_attributeMap)._M_h._M_single_bucket;
  (this->_attributeMap)._M_h._M_bucket_count = 1;
  (this->_attributeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_attributeMap)._M_h._M_element_count = 0;
  (this->_attributeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_attributeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_attributeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_relationsMap)._M_h._M_buckets = &(this->_relationsMap)._M_h._M_single_bucket;
  (this->_relationsMap)._M_h._M_bucket_count = 1;
  (this->_relationsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_relationsMap)._M_h._M_element_count = 0;
  (this->_relationsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_relationsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_relationsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  buildFromFile(this);
  return;
}

Assistant:

TreeDecomposition::TreeDecomposition()
{
    buildFromFile();
}